

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O0

void __thiscall cppnet::ConnectSocket::OnAccept(ConnectSocket *this)

{
  char cVar1;
  uint32_t uVar2;
  bool bVar3;
  uint16_t uVar4;
  shared_ptr<cppnet::AlloterWrap> *alloter_00;
  SingletonLogger *this_00;
  char *pcVar5;
  element_type *peVar6;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *this_01;
  mapped_type *this_02;
  element_type *this_03;
  SysCallInt64Result SVar7;
  shared_ptr<cppnet::RWSocket> local_100;
  shared_ptr<cppnet::AlloterWrap> *local_f0;
  undefined1 local_e8 [32];
  shared_ptr<cppnet::CppNetBase> local_c8;
  shared_ptr<cppnet::AlloterWrap> local_b8;
  undefined1 local_a8 [8];
  shared_ptr<cppnet::RWSocket> sock;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  SysCallInt64Result ret;
  Address address;
  shared_ptr<cppnet::Alloter> local_30;
  undefined1 local_20 [8];
  shared_ptr<cppnet::AlloterWrap> alloter;
  ConnectSocket *this_local;
  
  alloter.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  do {
    MakePoolAlloterPtr();
    std::make_shared<cppnet::AlloterWrap,std::shared_ptr<cppnet::Alloter>>
              ((shared_ptr<cppnet::Alloter> *)local_20);
    std::shared_ptr<cppnet::Alloter>::~shared_ptr(&local_30);
    Address::Address((Address *)&ret._errno);
    SVar7 = OsHandle::Accept((this->super_Socket)._sock,(Address *)&ret._errno);
    alloter_00 = (shared_ptr<cppnet::AlloterWrap> *)SVar7._return_value;
    ret._return_value._0_4_ = SVar7._errno;
    if ((long)alloter_00 < 0) {
      if (((uint32_t)ret._return_value == 0xb) || ((uint32_t)ret._return_value == 0x2733)) {
        cVar1 = '\x03';
      }
      else {
        this_00 = Singleton<cppnet::SingletonLogger>::Instance();
        uVar2 = (uint32_t)ret._return_value;
        pcVar5 = ErrnoInfo((uint32_t)ret._return_value);
        SingletonLogger::Error
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
                   ,0x6a,"accept socket filed! errno:%d, info:%s",(ulong)uVar2,pcVar5);
        cVar1 = '\x03';
      }
    }
    else {
      std::weak_ptr<cppnet::CppNetBase>::lock
                ((weak_ptr<cppnet::CppNetBase> *)
                 &sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      bVar3 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar3) {
        SocketNoblocking((uint64_t)alloter_00);
        std::shared_ptr<cppnet::AlloterWrap>::shared_ptr
                  (&local_b8,(shared_ptr<cppnet::AlloterWrap> *)local_20);
        MakeRWSocket((uint64_t)local_a8,alloter_00);
        std::shared_ptr<cppnet::AlloterWrap>::~shared_ptr(&local_b8);
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        uVar4 = Address::GetAddrPort(&(this->super_Socket)._addr);
        (*(peVar6->super_Socket)._vptr_Socket[3])(peVar6,(ulong)uVar4);
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        std::shared_ptr<cppnet::CppNetBase>::shared_ptr
                  (&local_c8,
                   (shared_ptr<cppnet::CppNetBase> *)
                   &sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Socket::SetCppNetBase(&peVar6->super_Socket,&local_c8);
        std::shared_ptr<cppnet::CppNetBase>::~shared_ptr(&local_c8);
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        std::weak_ptr<cppnet::EventActions>::weak_ptr
                  ((weak_ptr<cppnet::EventActions> *)(local_e8 + 0x10),
                   &(this->super_Socket)._event_actions);
        Socket::SetEventActions
                  (&peVar6->super_Socket,(weak_ptr<cppnet::EventActions> *)(local_e8 + 0x10));
        std::weak_ptr<cppnet::EventActions>::~weak_ptr
                  ((weak_ptr<cppnet::EventActions> *)(local_e8 + 0x10));
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        Socket::SetAddress(&peVar6->super_Socket,(Address *)&ret._errno);
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        Socket::GetDispatcher((Socket *)local_e8);
        Socket::SetDispatcher(&peVar6->super_Socket,(shared_ptr<cppnet::Dispatcher> *)local_e8);
        std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)local_e8)
        ;
        this_01 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
                   *)Socket::__all_socket_map();
        local_f0 = alloter_00;
        this_02 = std::
                  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
                  ::operator[](this_01,(key_type *)&local_f0);
        std::shared_ptr<cppnet::Socket>::operator=(this_02,(shared_ptr<cppnet::RWSocket> *)local_a8)
        ;
        this_03 = std::
                  __shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&sock.
                                   super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
        std::shared_ptr<cppnet::RWSocket>::shared_ptr
                  (&local_100,(shared_ptr<cppnet::RWSocket> *)local_a8);
        CppNetBase::OnAccept(this_03,&local_100);
        std::shared_ptr<cppnet::RWSocket>::~shared_ptr(&local_100);
        peVar6 = std::
                 __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        (*(peVar6->super_Socket)._vptr_Socket[7])();
        std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_a8);
      }
      cVar1 = !bVar3;
      std::shared_ptr<cppnet::CppNetBase>::~shared_ptr
                ((shared_ptr<cppnet::CppNetBase> *)
                 &sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    Address::~Address((Address *)&ret._errno);
    std::shared_ptr<cppnet::AlloterWrap>::~shared_ptr((shared_ptr<cppnet::AlloterWrap> *)local_20);
  } while (cVar1 == '\0');
  return;
}

Assistant:

void ConnectSocket::OnAccept() {
    while (true) {
        std::shared_ptr<AlloterWrap> alloter = std::make_shared<AlloterWrap>(MakePoolAlloterPtr());
        Address address;
        //may get more than one connections
        auto ret = OsHandle::Accept(_sock, address);
        if (ret._return_value < 0) {
            if (ret._errno == EAGAIN || ret._errno == WSAEWOULDBLOCK) {
                break;
            }
            LOG_ERROR("accept socket filed! errno:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
            break;
        }

        auto cppnet_base = _cppnet_base.lock();
        if (!cppnet_base) {
            return;
        }

        //set the socket noblocking
        SocketNoblocking(ret._return_value);
        
        //create a new socket.
        auto sock = MakeRWSocket(ret._return_value, alloter);

        sock->SetListenPort(_addr.GetAddrPort());
        sock->SetCppNetBase(cppnet_base);
        sock->SetEventActions(_event_actions);
        sock->SetAddress(std::move(address));
        sock->SetDispatcher(GetDispatcher());

        __all_socket_map[ret._return_value] = sock;
    
        //call accept call back function
        cppnet_base->OnAccept(sock);

        //start read
        sock->Read();
    }
}